

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObjectEnumerator.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArgumentsObjectEnumerator::Init
          (ES5ArgumentsObjectEnumerator *this,EnumeratorCache *enumeratorCache)

{
  BOOL BVar1;
  
  (this->super_ArgumentsObjectPrefixEnumerator).formalArgIndex = 0xffffffff;
  (this->super_ArgumentsObjectPrefixEnumerator).doneFormalArgs = false;
  this->enumeratedFormalsInObjectArrayCount = 0;
  BVar1 = DynamicObject::GetEnumerator
                    (&((this->super_ArgumentsObjectPrefixEnumerator).argumentsObject.ptr)->
                      super_DynamicObject,&this->objectEnumerator,
                     (this->super_ArgumentsObjectPrefixEnumerator).flags,
                     (((((this->super_ArgumentsObjectPrefixEnumerator).super_JavascriptEnumerator.
                         super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,enumeratorCache);
  return BVar1;
}

Assistant:

BOOL ES5ArgumentsObjectEnumerator::Init(EnumeratorCache * enumeratorCache)
    {
        __super::Reset();
        this->enumeratedFormalsInObjectArrayCount = 0;
        return argumentsObject->DynamicObject::GetEnumerator(&objectEnumerator, flags, GetScriptContext(), enumeratorCache);
    }